

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall
leveldb::VersionSet::AddLiveFiles
          (VersionSet *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *live)

{
  Version *pVVar1;
  pointer ppFVar2;
  int level;
  long lVar3;
  ulong uVar4;
  
  for (pVVar1 = (this->dummy_versions_).next_; pVVar1 != &this->dummy_versions_;
      pVVar1 = pVVar1->next_) {
    lVar3 = 0;
    do {
      ppFVar2 = pVVar1->files_[lVar3].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pVVar1->files_[lVar3].
          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppFVar2) {
        uVar4 = 0;
        do {
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)live,&ppFVar2[uVar4]->number);
          uVar4 = uVar4 + 1;
          ppFVar2 = pVVar1->files_[lVar3].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar4 < (ulong)((long)pVVar1->files_[lVar3].
                                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >>
                                3));
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 7);
  }
  return;
}

Assistant:

void VersionSet::AddLiveFiles(std::set<uint64_t>* live) {
  for (Version* v = dummy_versions_.next_; v != &dummy_versions_;
       v = v->next_) {
    for (int level = 0; level < config::kNumLevels; level++) {
      const std::vector<FileMetaData*>& files = v->files_[level];
      for (size_t i = 0; i < files.size(); i++) {
        live->insert(files[i]->number);
      }
    }
  }
}